

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_compileoption_get(int N)

{
  if ((uint)N < 3) {
    return sqlite3azCompileOpt[(uint)N];
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_compileoption_get(int N){
  int nOpt;
  const char **azCompileOpt;
  azCompileOpt = sqlite3CompileOptions(&nOpt);
  if( N>=0 && N<nOpt ){
    return azCompileOpt[N];
  }
  return 0;
}